

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void check_newlinechar(compiler_common *common,int nltype,jump_list **backtracks,BOOL jumpifmatch)

{
  sljit_compiler *compiler;
  sljit_jump *psVar1;
  sljit_jump *jump;
  sljit_label *label;
  uint type;
  sljit_sw src2w;
  
  compiler = common->compiler;
  if (nltype == 2) {
    psVar1 = sljit_emit_cmp(compiler,0,1,0,0x40,0xd);
    if (jumpifmatch == 0) {
      jump = sljit_emit_cmp(compiler,1,1,0,0x40,10);
      add_jump(compiler,backtracks,jump);
      label = sljit_emit_label(compiler);
      sljit_set_label(psVar1,label);
      return;
    }
    add_jump(compiler,backtracks,psVar1);
    src2w = 10;
    type = 0;
  }
  else {
    if (nltype == 1) {
      psVar1 = sljit_emit_jump(compiler,0x19);
      add_jump(compiler,&common->anynewline,psVar1);
      psVar1 = sljit_emit_jump(compiler,(uint)(jumpifmatch != 0));
      goto LAB_0013d09a;
    }
    type = (uint)(jumpifmatch == 0);
    src2w = (sljit_sw)common->newline;
  }
  psVar1 = sljit_emit_cmp(compiler,type,1,0,0x40,src2w);
LAB_0013d09a:
  add_jump(compiler,backtracks,psVar1);
  return;
}

Assistant:

static void check_newlinechar(compiler_common *common, int nltype, jump_list **backtracks, BOOL jumpifmatch)
{
/* Character comes in TMP1. Checks if it is a newline. TMP2 may be destroyed. */
DEFINE_COMPILER;
struct sljit_jump *jump;

if (nltype == NLTYPE_ANY)
  {
  add_jump(compiler, &common->anynewline, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(jumpifmatch ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  }
else if (nltype == NLTYPE_ANYCRLF)
  {
  if (jumpifmatch)
    {
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR));
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL));
    }
  else
    {
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL));
    JUMPHERE(jump);
    }
  }
else
  {
  SLJIT_ASSERT(nltype == NLTYPE_FIXED && common->newline < 256);
  add_jump(compiler, backtracks, CMP(jumpifmatch ? SLJIT_EQUAL : SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, common->newline));
  }
}